

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

vector<Span<const_char>,_std::allocator<Span<const_char>_>_> * __thiscall
util::Split<Span<char_const>>
          (vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *__return_storage_ptr__,
          util *this,Span<const_char> *sp,string_view separators)

{
  void *pvVar1;
  size_type __n;
  long in_FS_OFFSET;
  char *start;
  char *it;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = *(char **)this;
  local_48 = local_40;
  if (*(long *)(this + 8) != 0) {
    do {
      if (sp != (Span<const_char> *)0x0) {
        pvVar1 = memchr((void *)separators._M_len,(int)*local_40,(size_t)sp);
        if ((long)pvVar1 - (long)separators._M_len != -1 && pvVar1 != (void *)0x0) {
          std::vector<Span<char_const>,std::allocator<Span<char_const>>>::
          emplace_back<char_const*&,char_const*&>
                    ((vector<Span<char_const>,std::allocator<Span<char_const>>> *)
                     __return_storage_ptr__,&local_48,&local_40);
          local_48 = local_40 + 1;
        }
      }
      local_40 = local_40 + 1;
    } while (local_40 != (char *)(*(long *)this + *(long *)(this + 8)));
  }
  std::vector<Span<char_const>,std::allocator<Span<char_const>>>::
  emplace_back<char_const*&,char_const*&>
            ((vector<Span<char_const>,std::allocator<Span<char_const>>> *)__return_storage_ptr__,
             &local_48,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<T> Split(const Span<const char>& sp, std::string_view separators)
{
    std::vector<T> ret;
    auto it = sp.begin();
    auto start = it;
    while (it != sp.end()) {
        if (separators.find(*it) != std::string::npos) {
            ret.emplace_back(start, it);
            start = it + 1;
        }
        ++it;
    }
    ret.emplace_back(start, it);
    return ret;
}